

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void pk_record(CHAR_DATA *ch,CHAR_DATA *victim)

{
  short *psVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  CHAR_DATA *ach;
  ulong uVar8;
  CHAR_DATA *ach_00;
  float fVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  
  bVar3 = is_npc(victim);
  if ((!bVar3) && (bVar3 = is_npc(ch), !bVar3)) {
    iVar7 = 0x4b31c0;
    ach_00 = (CHAR_DATA *)0x0;
    if (char_list == (CHAR_DATA *)0x0) {
      fVar9 = 0.0;
    }
    else {
      iVar7 = 0;
      iVar5 = 0;
      ach = char_list;
      do {
        bVar3 = is_same_group(ach,ch);
        if (((bVar3) && (bVar3 = is_npc(ach), !bVar3)) &&
           ((ach->in_room == ch->in_room || (0 < ach->ghost)))) {
          fmt._M_str = "Adding {} to killer_group";
          fmt._M_len = 0x19;
          CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&ach->name);
          iVar5 = iVar5 + 1;
        }
        bVar3 = is_same_group(ach,ch);
        if (((bVar3) && (ach->in_room == ch->in_room)) && (bVar3 = is_npc(ach), !bVar3)) {
          fmt_00._M_str = "Adding {} to killer_in_room";
          fmt_00._M_len = 0x1b;
          CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt_00,&ach->name);
          ach_00 = (CHAR_DATA *)(ulong)((int)ach_00 + 1);
        }
        bVar3 = is_same_group(ach,victim);
        if ((bVar3) && ((ach->in_room == victim->in_room || (0 < ach->ghost)))) {
          fmt_01._M_str = "Adding {} to victim_group.";
          fmt_01._M_len = 0x1a;
          CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt_01,&ach->name);
          iVar7 = iVar7 + 1;
        }
        ach = ach->next;
      } while (ach != (CHAR_DATA *)0x0);
      fVar9 = (float)(int)ach_00;
      iVar7 = iVar7 / iVar5;
      ach_00 = char_list;
    }
    iVar5 = 1;
    if (iVar7 < 1) {
      iVar5 = iVar7;
    }
    victim->pcdata->fragged = victim->pcdata->fragged + (float)iVar5;
    if (ach_00 != (CHAR_DATA *)0x0) {
      fVar9 = (float)iVar5 / fVar9;
      do {
        bVar3 = is_same_group(ach_00,ch);
        if (((bVar3) && (bVar3 = can_pk(ach_00,victim), bVar3)) &&
           ((bVar3 = is_npc(ach_00), !bVar3 && (ach_00->in_room == ch->in_room)))) {
          ach_00->pcdata->frags[0] = ach_00->pcdata->frags[0] + fVar9;
          bVar3 = is_good(victim);
          lVar6 = 0xa0;
          if (bVar3) {
LAB_00294365:
            *(float *)((long)&ach_00->pcdata->next + lVar6) =
                 *(float *)((long)&ach_00->pcdata->next + lVar6) + fVar9;
          }
          else {
            bVar3 = is_neutral(victim);
            lVar6 = 0xa4;
            if (bVar3) goto LAB_00294365;
            bVar3 = is_evil(victim);
            lVar6 = 0xa8;
            if (bVar3) goto LAB_00294365;
          }
          if (ach_00->level < 0x33) {
            uVar8 = 0;
            do {
              pcVar4 = ach_00->pcdata->recentkills[uVar8];
              if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
                if (uVar8 < 0x5f) {
                  pcVar4 = palloc_string(victim->name);
                  ach_00->pcdata->recentkills[uVar8] = pcVar4;
                }
                break;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != 100);
          }
        }
        ach_00 = ach_00->next;
      } while (ach_00 != (CHAR_DATA *)0x0);
    }
    pPVar2 = ch->pcdata;
    pPVar2->kills[0] = pPVar2->kills[0] + 1;
    if (victim->alignment < 1) {
      if (victim->alignment == 0) {
        pPVar2->kills[2] = pPVar2->kills[2] + 1;
      }
      else {
        pPVar2->kills[3] = pPVar2->kills[3] + 1;
      }
    }
    else {
      pPVar2->kills[1] = pPVar2->kills[1] + 1;
    }
    psVar1 = victim->pcdata->killed;
    *psVar1 = *psVar1 + 1;
    if (ch->level < 0x33) {
      uVar8 = 0;
      do {
        if ((pPVar2->recentkills[uVar8] == (char *)0x0) || (*pPVar2->recentkills[uVar8] == '\0')) {
          if (0x5e < uVar8) {
            return;
          }
          pcVar4 = palloc_string(victim->name);
          ch->pcdata->recentkills[uVar8] = pcVar4;
          return;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 100);
    }
  }
  return;
}

Assistant:

void pk_record(CHAR_DATA *ch, CHAR_DATA *victim)
{
	CHAR_DATA *wch;
	int killer_group = 0, victim_group = 0;
	int killer_in_room = 0;
	float killer_credit, victim_credit;
	int i;

	if (is_npc(victim) || is_npc(ch))
		return;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && !is_npc(wch) && (wch->in_room == ch->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to killer_group", wch->name);
			killer_group++;
		}

		if (is_same_group(wch, ch) && wch->in_room == ch->in_room && !is_npc(wch))
		{
			RS.Logger.Info("Adding {} to killer_in_room", wch->name);
			killer_in_room++;
		}

		if (is_same_group(wch, victim) && (wch->in_room == victim->in_room || wch->ghost > 0))
		{
			RS.Logger.Info("Adding {} to victim_group.", wch->name);
			victim_group++;
		}
	}

	victim_credit = (float)(victim_group / killer_group);

	if (victim_credit > 1)
		victim_credit = 1;

	killer_credit = victim_credit;
	killer_credit = killer_credit / killer_in_room;
	victim->pcdata->fragged += victim_credit;

	for (wch = char_list; wch; wch = wch->next)
	{
		if (is_same_group(wch, ch) && can_pk(wch, victim) && !is_npc(wch) && wch->in_room == ch->in_room)
		{
			wch->pcdata->frags[PK_KILLS] += killer_credit;

			if (is_good(victim))
				wch->pcdata->frags[PK_GOOD] += killer_credit;
			else if (is_neutral(victim))
				wch->pcdata->frags[PK_NEUTRAL] += killer_credit;
			else if (is_evil(victim))
				wch->pcdata->frags[PK_EVIL] += killer_credit;

			if (wch->level < 51)
			{
				for (i = 0; i < 100; i++)
				{
					if (wch->pcdata->recentkills[i] == nullptr)
						break;

					if (*(wch->pcdata->recentkills[i]) == '\0')
						break;
				}

				if (i < 95)
					wch->pcdata->recentkills[i] = palloc_string(victim->name);
			}
		}
	}

	ch->pcdata->kills[PK_KILLS]++;

	if (victim->alignment > 0)
		ch->pcdata->kills[PK_GOOD]++;
	else if (victim->alignment == 0)
		ch->pcdata->kills[PK_NEUTRAL]++;
	else if (victim->alignment < 0)
		ch->pcdata->kills[PK_EVIL]++;

	victim->pcdata->killed[PK_KILLED]++;

	if (ch->level < 51)
	{
		for (i = 0; i < 100; i++)
		{
			if (ch->pcdata->recentkills[i] == nullptr)
				break;

			if (*(ch->pcdata->recentkills[i]) == '\0')
				break;
		}

		if (i < 95)
			ch->pcdata->recentkills[i] = palloc_string(victim->name);
	}
}